

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O0

void __thiscall FNodeBuilder::AddSegs(FNodeBuilder *this,seg_t *segs,int numsegs)

{
  uint uVar1;
  FPrivVert *pFVar2;
  fixed_t local_78;
  int segnum;
  FPrivVert vert;
  FPrivSeg seg;
  int i;
  int numsegs_local;
  seg_t *segs_local;
  FNodeBuilder *this_local;
  
  if (0 < numsegs) {
    for (seg.hashnext._0_4_ = 0; (int)seg.hashnext < numsegs;
        seg.hashnext._0_4_ = (int)seg.hashnext + 1) {
      local_78 = vertex_t::fixX(segs[(int)seg.hashnext].v1);
      segnum = vertex_t::fixY(segs[(int)seg.hashnext].v1);
      vert.segs = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,&local_78);
      local_78 = vertex_t::fixX(segs[(int)seg.hashnext].v2);
      segnum = vertex_t::fixY(segs[(int)seg.hashnext].v2);
      vert.segs2 = (*this->VertexMap->_vptr_IVertexMap[2])(this->VertexMap,&local_78);
      TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                (&this->Vertices,(long)(int)vert.segs);
      TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                (&this->Vertices,(long)(int)vert.segs2);
      uVar1 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Push
                        (&this->Segs,(FPrivSeg *)&vert.segs);
      pFVar2 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)(int)vert.segs);
      pFVar2->segs = uVar1;
      pFVar2 = TArray<FNodeBuilder::FPrivVert,_FNodeBuilder::FPrivVert>::operator[]
                         (&this->Vertices,(long)(int)vert.segs2);
      pFVar2->segs2 = uVar1;
    }
    return;
  }
  __assert_fail("numsegs > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/nodebuild_utility.cpp"
                ,0xcf,"void FNodeBuilder::AddSegs(seg_t *, int)");
}

Assistant:

void FNodeBuilder::AddSegs(seg_t *segs, int numsegs)
{
	assert(numsegs > 0);

	for (int i = 0; i < numsegs; ++i)
	{
		FPrivSeg seg;
		FPrivVert vert;
		int segnum;

		seg.next = DWORD_MAX;
		seg.loopnum = 0;
		seg.partner = DWORD_MAX;
		seg.hashnext = NULL;
		seg.planefront = false;
		seg.planenum = DWORD_MAX;
		seg.storedseg = DWORD_MAX;

		seg.frontsector = segs[i].frontsector;
		seg.backsector = segs[i].backsector;
		vert.x = segs[i].v1->fixX();
		vert.y = segs[i].v1->fixY();
		seg.v1 = VertexMap->SelectVertexExact(vert);
		vert.x = segs[i].v2->fixX();
		vert.y = segs[i].v2->fixY();
		seg.v2 = VertexMap->SelectVertexExact(vert);
		seg.linedef = int(segs[i].linedef - Level.Lines);
		seg.sidedef = segs[i].sidedef != NULL ? int(segs[i].sidedef - Level.Sides) : int(NO_SIDE);
		seg.nextforvert = Vertices[seg.v1].segs;
		seg.nextforvert2 = Vertices[seg.v2].segs2;

		segnum = (int)Segs.Push(seg);
		Vertices[seg.v1].segs = segnum;
		Vertices[seg.v2].segs2 = segnum;
	}
}